

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh_ngon.cpp
# Opt level: O1

void __thiscall
ON_MeshSeparateNgonInfo::ON_MeshSeparateNgonInfo
          (ON_MeshSeparateNgonInfo *this,ON_Mesh *mesh,uint **vertex_face_map)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  uint *puVar4;
  
  this->m_mesh = mesh;
  this->m_vertex_face_map = vertex_face_map;
  uVar3 = 0;
  this->m_ngondex_from_facedex_map = (uint *)0x0;
  this->m_ngon_vmap = (uint *)0x0;
  uVar2 = 0;
  if (mesh != (ON_Mesh *)0x0) {
    uVar2 = ON_Mesh::FaceUnsignedCount(mesh);
  }
  this->m_face_count = uVar2;
  if (mesh != (ON_Mesh *)0x0) {
    uVar3 = ON_Mesh::VertexUnsignedCount(mesh);
  }
  this->m_vertex_count0 = uVar3;
  this->m_vertex_count1 = uVar3;
  this->m_vertex_count2 = uVar3;
  this->m_ni = 0xffffffff;
  this->m_fi = 0xffffffff;
  this->m_vi = 0xffffffff;
  this->m_ngon_vmark = 0;
  this->m_ngon = (ON_MeshNgon *)0x0;
  (this->m_ngon_vmap_buffer)._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_0081c860;
  (this->m_ngon_vmap_buffer).m_a = (uint *)0x0;
  (this->m_ngon_vmap_buffer).m_count = 0;
  (this->m_ngon_vmap_buffer).m_capacity = 0;
  ON_MeshVertexFaceMap::ON_MeshVertexFaceMap(&this->m_local_vfmap);
  ON_FixedSizePool::ON_FixedSizePool(&this->m_virefpool);
  if (mesh == (ON_Mesh *)0x0) {
    return;
  }
  if (this->m_face_count == (mesh->m_NgonMap).m_count) {
    if (((mesh->m_Ngon).m_count == 0) || ((mesh->m_F).m_count != (mesh->m_NgonMap).m_count)) {
LAB_00533538:
      puVar4 = (uint *)0x0;
      goto LAB_00533550;
    }
  }
  else {
    bVar1 = ON_Mesh::CreateNgonMap(mesh,&mesh->m_NgonMap);
    if (!bVar1) goto LAB_00533538;
  }
  puVar4 = (mesh->m_NgonMap).m_a;
LAB_00533550:
  this->m_ngondex_from_facedex_map = puVar4;
  if (this->m_vertex_face_map == (uint **)0x0) {
    ON_MeshVertexFaceMap::SetFromMesh(&this->m_local_vfmap,mesh,true);
    this->m_vertex_face_map = (this->m_local_vfmap).m_vertex_face_map;
  }
  return;
}

Assistant:

ON_MeshSeparateNgonInfo(
    ON_Mesh* mesh,
    unsigned int** vertex_face_map
    )
    : m_mesh(mesh)
    , m_vertex_face_map(vertex_face_map)
    , m_face_count(mesh ? mesh->FaceUnsignedCount() : 0)
    , m_vertex_count0(mesh ? mesh->VertexUnsignedCount() : 0)
    , m_vertex_count1(m_vertex_count0)
    , m_vertex_count2(m_vertex_count0)
  {
    if ( 0 != mesh )
    {
      m_ngondex_from_facedex_map = ( m_face_count != mesh->m_NgonMap.UnsignedCount() )
        ? mesh->CreateNgonMap()
        : mesh->NgonMap();
    
      if ( 0 == m_vertex_face_map )
      {
        m_local_vfmap.SetFromMesh(mesh,true);
        m_vertex_face_map = const_cast<unsigned int**>(m_local_vfmap.VertexFaceMap());
      }
    }
  }